

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transient_suppressor.cc
# Opt level: O0

void __thiscall
webrtc::TransientSuppressor::Suppress
          (TransientSuppressor *this,float *in_ptr,float *spectral_mean,float *out_ptr)

{
  float fVar1;
  size_t sVar2;
  type pfVar3;
  pointer pfVar4;
  pointer puVar5;
  pointer pfVar6;
  unique_ptr<float[],_std::default_delete<float[]>_> *this_00;
  float fVar7;
  float local_88;
  ulong local_50;
  size_t i_3;
  ulong uStack_40;
  float fft_scaling;
  size_t i_2;
  size_t i_1;
  size_t i;
  float *out_ptr_local;
  float *spectral_mean_local;
  float *in_ptr_local;
  TransientSuppressor *this_local;
  
  for (i_1 = 0; i_1 < this->analysis_length_; i_1 = i_1 + 1) {
    fVar7 = in_ptr[i_1];
    fVar1 = this->window_[i_1];
    pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       (&this->fft_buffer_,i_1);
    *pfVar3 = fVar7 * fVar1;
  }
  sVar2 = this->analysis_length_;
  pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->fft_buffer_);
  puVar5 = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::get(&this->ip_);
  pfVar6 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->wfft_);
  WebRtc_rdft(sVar2,1,pfVar4,puVar5,pfVar6);
  pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&this->fft_buffer_,1)
  ;
  fVar7 = *pfVar3;
  pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                     (&this->fft_buffer_,this->analysis_length_);
  *pfVar3 = fVar7;
  pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                     (&this->fft_buffer_,this->analysis_length_ + 1);
  *pfVar3 = 0.0;
  pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&this->fft_buffer_,1)
  ;
  *pfVar3 = 0.0;
  for (i_2 = 0; i_2 < this->complex_analysis_length_; i_2 = i_2 + 1) {
    pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       (&this->fft_buffer_,i_2 << 1);
    fVar7 = *pfVar3;
    pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       (&this->fft_buffer_,i_2 * 2 + 1);
    fVar7 = anon_unknown_5::ComplexMagnitude(fVar7,*pfVar3);
    pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       (&this->magnitudes_,i_2);
    *pfVar3 = fVar7;
  }
  if ((this->suppression_enabled_ & 1U) != 0) {
    if ((this->use_hard_restoration_ & 1U) == 0) {
      SoftRestoration(this,spectral_mean);
    }
    else {
      HardRestoration(this,spectral_mean);
    }
  }
  for (uStack_40 = 0; uStack_40 < this->complex_analysis_length_; uStack_40 = uStack_40 + 1) {
    fVar7 = spectral_mean[uStack_40];
    pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       (&this->magnitudes_,uStack_40);
    spectral_mean[uStack_40] = fVar7 * 0.5 + *pfVar3 * 0.5;
  }
  this_00 = &this->fft_buffer_;
  pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                     (this_00,this->analysis_length_);
  fVar7 = *pfVar3;
  pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](this_00,1);
  *pfVar3 = fVar7;
  sVar2 = this->analysis_length_;
  pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(this_00);
  puVar5 = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::get(&this->ip_);
  pfVar6 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->wfft_);
  WebRtc_rdft(sVar2,-1,pfVar4,puVar5,pfVar6);
  local_88 = (float)this->analysis_length_;
  for (local_50 = 0; local_50 < this->analysis_length_; local_50 = local_50 + 1) {
    pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       (&this->fft_buffer_,local_50);
    out_ptr[local_50] = *pfVar3 * this->window_[local_50] * (2.0 / local_88) + out_ptr[local_50];
  }
  return;
}

Assistant:

void TransientSuppressor::Suppress(float* in_ptr,
                                   float* spectral_mean,
                                   float* out_ptr) {
  // Go to frequency domain.
  for (size_t i = 0; i < analysis_length_; ++i) {
    // TODO(aluebs): Rename windows
    fft_buffer_[i] = in_ptr[i] * window_[i];
  }

  WebRtc_rdft(analysis_length_, 1, fft_buffer_.get(), ip_.get(), wfft_.get());

  // Since WebRtc_rdft puts R[n/2] in fft_buffer_[1], we move it to the end
  // for convenience.
  fft_buffer_[analysis_length_] = fft_buffer_[1];
  fft_buffer_[analysis_length_ + 1] = 0.f;
  fft_buffer_[1] = 0.f;

  for (size_t i = 0; i < complex_analysis_length_; ++i) {
    magnitudes_[i] = ComplexMagnitude(fft_buffer_[i * 2],
                                      fft_buffer_[i * 2 + 1]);
  }
  // Restore audio if necessary.
  if (suppression_enabled_) {
    if (use_hard_restoration_) {
      HardRestoration(spectral_mean);
    } else {
      SoftRestoration(spectral_mean);
    }
  }

  // Update the spectral mean.
  for (size_t i = 0; i < complex_analysis_length_; ++i) {
    spectral_mean[i] = (1 - kMeanIIRCoefficient) * spectral_mean[i] +
                       kMeanIIRCoefficient * magnitudes_[i];
  }

  // Back to time domain.
  // Put R[n/2] back in fft_buffer_[1].
  fft_buffer_[1] = fft_buffer_[analysis_length_];

  WebRtc_rdft(analysis_length_,
              -1,
              fft_buffer_.get(),
              ip_.get(),
              wfft_.get());
  const float fft_scaling = 2.f / analysis_length_;

  for (size_t i = 0; i < analysis_length_; ++i) {
    out_ptr[i] += fft_buffer_[i] * window_[i] * fft_scaling;
  }
}